

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O3

int nni_msgq_resize(nni_msgq *mq,int cap)

{
  uint uVar1;
  nni_msg *m;
  nni_msg **ptr;
  uint uVar2;
  nni_msg **ppnVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar1 = cap + 2;
  if (mq->mq_alloc < uVar1) {
    ppnVar3 = (nni_msg **)nni_zalloc((ulong)uVar1 << 3);
    if (ppnVar3 == (nni_msg **)0x0) {
      return 2;
    }
  }
  else {
    ppnVar3 = (nni_msg **)0x0;
  }
  nni_mtx_lock(&mq->mq_lock);
  uVar2 = mq->mq_len;
  if (cap + 1U < uVar2) {
    do {
      uVar6 = mq->mq_get + 1;
      if (mq->mq_alloc < uVar6) {
        uVar6 = 0;
      }
      m = mq->mq_msgs[mq->mq_get];
      mq->mq_get = uVar6;
      mq->mq_len = uVar2 - 1;
      nni_msg_free(m);
      uVar2 = mq->mq_len;
    } while (cap + 1U < uVar2);
  }
  if (ppnVar3 == (nni_msg **)0x0) {
    mq->mq_cap = cap;
  }
  else {
    ptr = mq->mq_msgs;
    uVar6 = mq->mq_alloc;
    uVar4 = mq->mq_get;
    mq->mq_msgs = ppnVar3;
    mq->mq_put = 0;
    mq->mq_len = 0;
    mq->mq_get = 0;
    mq->mq_cap = cap;
    mq->mq_alloc = uVar1;
    if (uVar2 != 0) {
      uVar7 = 0;
      uVar9 = uVar2;
      do {
        uVar5 = uVar4 + 1;
        uVar8 = uVar7 + 1;
        mq->mq_msgs[uVar7] = ptr[uVar4];
        uVar4 = uVar5;
        if (uVar5 == uVar6) {
          uVar4 = 0;
        }
        uVar7 = uVar8;
        if (uVar8 == uVar1) {
          uVar7 = 0;
        }
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      mq->mq_put = uVar7;
      mq->mq_len = uVar2;
    }
    nni_free(ptr,(ulong)uVar6 << 3);
  }
  nni_mtx_unlock(&mq->mq_lock);
  return 0;
}

Assistant:

int
nni_msgq_resize(nni_msgq *mq, int cap)
{
	unsigned  alloc;
	nni_msg  *msg;
	nni_msg **newq, **oldq;
	unsigned  oldget;
	unsigned  oldlen;
	unsigned  oldalloc;

	alloc = cap + 2;

	if (alloc > mq->mq_alloc) {
		newq = nni_zalloc(sizeof(nni_msg *) * alloc);
		if (newq == NULL) {
			return (NNG_ENOMEM);
		}
	} else {
		newq = NULL;
	}

	nni_mtx_lock(&mq->mq_lock);
	while (mq->mq_len > ((unsigned) cap + 1)) {
		// too many messages -- we allow that one for
		// the case of pushback or cap == 0.
		// we delete the oldest messages first
		msg = mq->mq_msgs[mq->mq_get++];
		if (mq->mq_get > mq->mq_alloc) {
			mq->mq_get = 0;
		}
		mq->mq_len--;
		nni_msg_free(msg);
	}
	if (newq == NULL) {
		// Just shrinking the queue, no changes
		mq->mq_cap = cap;
		goto out;
	}

	oldq     = mq->mq_msgs;
	oldget   = mq->mq_get;
	oldalloc = mq->mq_alloc;
	oldlen   = mq->mq_len;

	mq->mq_msgs = newq;
	mq->mq_len = mq->mq_get = mq->mq_put = 0;
	mq->mq_cap                           = cap;
	mq->mq_alloc                         = alloc;

	while (oldlen) {
		mq->mq_msgs[mq->mq_put++] = oldq[oldget++];
		if (oldget == oldalloc) {
			oldget = 0;
		}
		if (mq->mq_put == mq->mq_alloc) {
			mq->mq_put = 0;
		}
		mq->mq_len++;
		oldlen--;
	}
	nni_free(oldq, sizeof(nni_msg *) * oldalloc);

out:
	// Wake everyone up -- we changed everything.
	nni_mtx_unlock(&mq->mq_lock);
	return (0);
}